

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

uint16_t wirehair::LinearInterpolate(int N0,int N1,int Count0,int Count1,int N)

{
  int count;
  int denominator;
  int numerator;
  int N_local;
  int Count1_local;
  int Count0_local;
  int N1_local;
  int N0_local;
  
  return (short)Count0 + (short)(((N - N0) * (Count1 - Count0)) / (N1 - N0));
}

Assistant:

static uint16_t LinearInterpolate(
    int N0, int N1,
    int Count0, int Count1,
    int N)
{
    CAT_DEBUG_ASSERT(N >= N0 && N <= N1);

    const int numerator = (N - N0) * (Count1 - Count0);
    const int denominator = N1 - N0;

    const int count = Count0 + (unsigned)(numerator / denominator);

    CAT_DEBUG_ASSERT(count > 0);

    return static_cast<uint16_t>(count);
}